

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O3

Span * __thiscall tcmalloc::PageHeap::AllocLarge(PageHeap *this,Length n)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Span *span;
  Span *span_00;
  
  p_Var1 = &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header;
  do {
    p_Var4 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    if (p_Var4 == (_Base_ptr)0x0) {
LAB_0011c2ab:
      span = (Span *)0x0;
    }
    else {
      do {
        lVar5 = 0x10;
        p_Var7 = p_Var4;
        if ((p_Var4[1]._M_parent <= n) &&
           ((p_Var4[1]._M_parent < n || (**(long **)(p_Var4 + 1) == 0)))) {
          lVar5 = 0x18;
          p_Var7 = p_Var6;
        }
        p_Var4 = *(_Base_ptr *)((long)&((_Rb_tree_node_base *)&p_Var4->_M_color)->_M_color + lVar5);
        p_Var6 = p_Var7;
      } while (p_Var4 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var7 == p_Var1) goto LAB_0011c2ab;
      span = *(Span **)(p_Var7 + 1);
    }
    p_Var4 = (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var2->_M_header;
    span_00 = span;
    if (p_Var4 == (_Base_ptr)0x0) {
LAB_0011c385:
      span = span_00;
      if (span_00 == (Span *)0x0) {
        return (Span *)0x0;
      }
LAB_0011c38a:
      Carve(this,span,n);
      return span;
    }
    do {
      lVar5 = 0x10;
      p_Var7 = p_Var4;
      if ((p_Var4[1]._M_parent <= n) &&
         ((p_Var4[1]._M_parent < n || (**(long **)(p_Var4 + 1) == 0)))) {
        lVar5 = 0x18;
        p_Var7 = p_Var6;
      }
      p_Var4 = *(_Base_ptr *)((long)&((_Rb_tree_node_base *)&p_Var4->_M_color)->_M_color + lVar5);
      p_Var6 = p_Var7;
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var7 == p_Var2) goto LAB_0011c385;
    span_00 = *(Span **)(p_Var7 + 1);
    if (((span != (Span *)0x0) && (span->length <= span_00->length)) &&
       ((span_00->length != span->length || (span->start <= span_00->start)))) goto LAB_0011c38a;
    if (span_00 == span) goto LAB_0011c385;
    if ((FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
         FLAGS_tcmalloc_heap_limit_mb == 0) ||
       (((TCMalloc_SystemTaken >> 0xd) + n) - ((this->stats_).unmapped_bytes >> 0xd) <=
        (ulong)(FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
                FLAGS_tcmalloc_heap_limit_mb << 7))) {
      Carve(this,span_00,n);
      return span_00;
    }
    bVar3 = EnsureLimit(this,n,true);
    if (!bVar3) {
      return (Span *)0x0;
    }
  } while( true );
}

Assistant:

Span* PageHeap::AllocLarge(Length n) {
  ASSERT(lock_.IsHeld());
  Span *best = nullptr;
  Span *best_normal = nullptr;

  // Create a Span to use as an upper bound.
  Span bound;
  bound.start = 0;
  bound.length = n;

  // First search the NORMAL spans..
  SpanSetIter place = large_normal_.upper_bound(SpanPtrWithLength(&bound));
  if (place != large_normal_.end()) {
    best = place->span;
    best_normal = best;
    ASSERT(best->location == Span::ON_NORMAL_FREELIST);
  }

  // Try to find better fit from RETURNED spans.
  place = large_returned_.upper_bound(SpanPtrWithLength(&bound));
  if (place != large_returned_.end()) {
    Span *c = place->span;
    ASSERT(c->location == Span::ON_RETURNED_FREELIST);
    if (best_normal == nullptr
        || c->length < best->length
        || (c->length == best->length && c->start < best->start))
      best = place->span;
  }

  if (best == best_normal) {
    return best == nullptr ? nullptr : Carve(best, n);
  }

  // best comes from RETURNED set.

  if (EnsureLimit(n, false)) {
    return Carve(best, n);
  }

  if (EnsureLimit(n, true)) {
    // best could have been destroyed by coalescing.
    // best_normal is not a best-fit, and it could be destroyed as well.
    // We retry, the limit is already ensured:
    return AllocLarge(n);
  }

  // If best_normal existed, EnsureLimit would succeeded:
  ASSERT(best_normal == nullptr);
  // We are not allowed to take best from returned list.
  return nullptr;
}